

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_decomposer.hpp
# Opt level: O0

void __thiscall
Catch::UnaryExpr<isocpp_p1950::indirect_value<int,_stats,_stats>_&>::streamReconstructedExpression
          (UnaryExpr<isocpp_p1950::indirect_value<int,_stats,_stats>_&> *this,ostream *os)

{
  indirect_value<int,_stats,_stats> *in_RDX;
  string local_38;
  ostream *local_18;
  ostream *os_local;
  UnaryExpr<isocpp_p1950::indirect_value<int,_stats,_stats>_&> *this_local;
  
  local_18 = os;
  os_local = (ostream *)this;
  Detail::stringify<isocpp_p1950::indirect_value<int,stats,stats>>
            (&local_38,(Detail *)this->m_lhs,in_RDX);
  std::operator<<(os,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            os << Catch::Detail::stringify( m_lhs );
        }